

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

bool __thiscall
wasm::ValidationInfo::shouldBeEqual<wasm::If*,wasm::Type>
          (ValidationInfo *this,Type left,Type right,If *curr,char *text,Function *func)

{
  ostream *poVar1;
  ostringstream local_1d8 [8];
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Function *local_40;
  If *local_38;
  
  if (left.id != right.id) {
    local_40 = func;
    local_38 = curr;
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar1 = wasm::operator<<((ostream *)local_1d8,left);
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = wasm::operator<<(poVar1,right);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,text);
    std::__cxx11::stringbuf::str();
    fail<wasm::If*,std::__cxx11::string>(this,&local_60,local_38,local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  return left.id == right.id;
}

Assistant:

bool shouldBeEqual(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }